

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_ldst.inc.c
# Opt level: O0

uint32_t address_space_lduw_internal_cached_slow_ppc64
                   (uc_struct_conflict11 *uc,MemoryRegionCache *cache,hwaddr addr,MemTxAttrs attrs,
                   MemTxResult *result,device_endian endian)

{
  hwaddr mr_00;
  MemoryRegionCache *uc_00;
  _Bool _Var1;
  MemOp_conflict MVar2;
  MemTxResult local_64;
  _Bool release_lock;
  ram_addr_t rStack_60;
  MemTxResult r;
  hwaddr addr1;
  hwaddr l;
  MemoryRegion *mr;
  uint64_t val;
  uint8_t *ptr;
  MemTxResult *pMStack_30;
  device_endian endian_local;
  MemTxResult *result_local;
  hwaddr addr_local;
  MemoryRegionCache *cache_local;
  uc_struct_conflict11 *uc_local;
  MemTxAttrs attrs_local;
  
  addr1 = 2;
  ptr._4_4_ = endian;
  pMStack_30 = result;
  result_local = (MemTxResult *)addr;
  addr_local = (hwaddr)cache;
  cache_local = (MemoryRegionCache *)uc;
  uc_local._4_4_ = attrs;
  l = (hwaddr)address_space_translate_cached(cache,addr,&stack0xffffffffffffffa0,&addr1,false,attrs)
  ;
  if (1 < addr1) {
    _Var1 = memory_access_is_direct((MemoryRegion *)l,false);
    if (_Var1) {
      val = (uint64_t)
            qemu_map_ram_ptr_ppc64
                      (*(uc_struct_conflict11 **)(l + 0x80),*(RAMBlock **)(l + 8),rStack_60);
      if (ptr._4_4_ == DEVICE_BIG_ENDIAN) {
        mr._0_4_ = lduw_be_p((void *)val);
      }
      else if (ptr._4_4_ == DEVICE_LITTLE_ENDIAN) {
        mr._0_4_ = lduw_le_p((void *)val);
      }
      else {
        mr._0_4_ = lduw_be_p((void *)val);
      }
      local_64 = 0;
      goto LAB_00fbb6c7;
    }
  }
  prepare_mmio_access((MemoryRegion *)l);
  uc_00 = cache_local;
  mr_00 = l;
  MVar2 = devend_memop(ptr._4_4_);
  local_64 = memory_region_dispatch_read_ppc64
                       ((uc_struct_conflict11 *)uc_00,(MemoryRegion *)mr_00,rStack_60,
                        (uint64_t *)&mr,MVar2 | MO_16,uc_local._4_4_);
LAB_00fbb6c7:
  if (pMStack_30 != (MemTxResult *)0x0) {
    *pMStack_30 = local_64;
  }
  return (uint32_t)mr;
}

Assistant:

static inline uint32_t glue(address_space_lduw_internal, SUFFIX)(struct uc_struct *uc, ARG1_DECL,
    hwaddr addr, MemTxAttrs attrs, MemTxResult *result,
    enum device_endian endian)
{
    uint8_t *ptr;
    uint64_t val;
    MemoryRegion *mr;
    hwaddr l = 2;
    hwaddr addr1;
    MemTxResult r;
    bool release_lock = false;

    //RCU_READ_LOCK();
    mr = TRANSLATE(addr, &addr1, &l, false, attrs);
    if (l < 2 || !memory_access_is_direct(mr, false)) {
        release_lock |= prepare_mmio_access(mr);

        /* I/O case */
        r = memory_region_dispatch_read(uc, mr, addr1, &val,
                                        MO_16 | devend_memop(endian), attrs);
    } else {
        /* RAM case */
        ptr = qemu_map_ram_ptr(mr->uc, mr->ram_block, addr1);
        switch (endian) {
        case DEVICE_LITTLE_ENDIAN:
            val = lduw_le_p(ptr);
            break;
        case DEVICE_BIG_ENDIAN:
            val = lduw_be_p(ptr);
            break;
        default:
            val = lduw_p(ptr);
            break;
        }
        r = MEMTX_OK;
    }
    if (result) {
        *result = r;
    }
    //RCU_READ_UNLOCK();
    return val;
}